

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetPchFile
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  cmMakefile *pcVar1;
  bool bVar2;
  pointer ppVar3;
  string *psVar4;
  cmGlobalGenerator *this_00;
  ulong uVar5;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  _Var6;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [8];
  string pchFileObject;
  string local_170;
  cmValue local_150;
  cmValue pchReuseFrom;
  cmGeneratorTarget *generatorTarget;
  undefined1 local_138 [6];
  anon_class_1_0_00000001 replaceExtension;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  string pchExtension;
  string *pchFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_68;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  inserted;
  string *arch_local;
  string *language_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  inserted._8_8_ = arch;
  std::operator+(&local_a8,language,config);
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)inserted._8_8_
                );
  std::make_pair<std::__cxx11::string,char_const(&)[1]>(&local_68,&local_88,(char (*) [1])0xe2f737);
  _Var6 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,char_const*>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->PchFiles,&local_68);
  local_40 = _Var6.first._M_node;
  inserted.first._M_node._0_1_ = _Var6.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::~pair(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  if (((byte)inserted.first._M_node & 1) != 0) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_40);
    pchExtension.field_2._8_8_ = &ppVar3->second;
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"CMAKE_PCH_EXTENSION",&local_111);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_110);
    std::__cxx11::string::string((string *)local_f0,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,"CMAKE_LINK_PCH",(allocator<char> *)((long)&generatorTarget + 7))
    ;
    bVar2 = cmMakefile::IsOn(pcVar1,(string *)local_138);
    std::__cxx11::string::~string((string *)local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&generatorTarget + 7));
    if (bVar2) {
      pchReuseFrom.Value = (string *)this;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"PRECOMPILE_HEADERS_REUSE_FROM",
                 (allocator<char> *)(pchFileObject.field_2._M_local_buf + 0xf));
      local_150 = GetProperty(this,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator
                ((allocator<char> *)(pchFileObject.field_2._M_local_buf + 0xf));
      bVar2 = cmValue::operator_cast_to_bool(&local_150);
      if (bVar2) {
        this_00 = GetGlobalGenerator(this);
        psVar4 = cmValue::operator*[abi_cxx11_(&local_150);
        pchReuseFrom.Value = (string *)cmGlobalGenerator::FindGeneratorTarget(this_00,psVar4);
      }
      GetPchFileObject((string *)local_198,(cmGeneratorTarget *)pchReuseFrom.Value,config,language,
                       (string *)inserted._8_8_);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        GetPchFile(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
        ::$_0::operator()::string_const___const
                  (&local_1b8,(void *)((long)&generatorTarget + 6),(string *)local_198,
                   (string *)local_f0);
        std::__cxx11::string::operator=((string *)pchExtension.field_2._8_8_,(string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      std::__cxx11::string::~string((string *)local_198);
    }
    else {
      GetPchHeader(&local_1d8,this,config,language,(string *)inserted._8_8_);
      std::__cxx11::string::operator=((string *)pchExtension.field_2._8_8_,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::operator+=((string *)pchExtension.field_2._8_8_,(string *)local_f0);
    }
    std::__cxx11::string::~string((string *)local_f0);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_40);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar3->second);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchFile(const std::string& config,
                                          const std::string& language,
                                          const std::string& arch)
{
  const auto inserted =
    this->PchFiles.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    std::string& pchFile = inserted.first->second;

    const std::string pchExtension =
      this->Makefile->GetSafeDefinition("CMAKE_PCH_EXTENSION");

    if (this->Makefile->IsOn("CMAKE_LINK_PCH")) {
      auto replaceExtension = [](const std::string& str,
                                 const std::string& ext) -> std::string {
        auto dot_pos = str.rfind('.');
        std::string result;
        if (dot_pos != std::string::npos) {
          result = str.substr(0, dot_pos);
        }
        result += ext;
        return result;
      };

      cmGeneratorTarget* generatorTarget = this;
      cmValue pchReuseFrom =
        generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      if (pchReuseFrom) {
        generatorTarget =
          this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
      }

      const std::string pchFileObject =
        generatorTarget->GetPchFileObject(config, language, arch);
      if (!pchExtension.empty()) {
        pchFile = replaceExtension(pchFileObject, pchExtension);
      }
    } else {
      pchFile = this->GetPchHeader(config, language, arch);
      pchFile += pchExtension;
    }
  }
  return inserted.first->second;
}